

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O2

REF_STATUS ref_sort_shuffle(REF_INT n,REF_INT *permutation)

{
  uint uVar1;
  REF_INT RVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar5 = 0;
  uVar7 = 0;
  if (0 < n) {
    uVar7 = (ulong)(uint)n;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    permutation[uVar5] = (REF_INT)uVar5;
  }
  uVar1 = n - 1;
  uVar7 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    iVar3 = rand();
    uVar6 = (uint)uVar7 + iVar3 % n;
    if ((int)uVar1 <= (int)uVar6) {
      uVar6 = uVar1;
    }
    uVar4 = (uint)uVar7;
    if (-1 < iVar3 % n) {
      uVar4 = uVar6;
    }
    RVar2 = permutation[(int)uVar4];
    permutation[(int)uVar4] = permutation[uVar7];
    permutation[uVar7] = RVar2;
    n = n + -1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_shuffle(REF_INT n, REF_INT *permutation) {
  REF_INT i, j, temp;
  for (i = 0; i < n; i++) permutation[i] = i;
  for (i = 0; i < n - 1; i++) {
    j = rand() % (n - 1 - i + 1) + i; /* i <= j < n */
    j = MAX(i, MIN(j, n - 1));        /* not needed, but don't trust myself */
    temp = permutation[j];
    permutation[j] = permutation[i];
    permutation[i] = temp;
  }
  return REF_SUCCESS;
}